

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_pmaps.cc
# Opt level: O0

void * v2i_POLICY_MAPPINGS(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  CONF_VALUE *pCVar1;
  POLICY_MAPPING *a;
  size_t sVar2;
  ASN1_OBJECT *pAVar3;
  POLICY_MAPPING *pmap;
  CONF_VALUE *val;
  size_t i;
  POLICY_MAPPINGS *pmaps;
  stack_st_CONF_VALUE *nval_local;
  X509V3_CTX *ctx_local;
  X509V3_EXT_METHOD *method_local;
  
  method_local = (X509V3_EXT_METHOD *)sk_POLICY_MAPPING_new_null();
  if (method_local == (X509V3_EXT_METHOD *)0x0) {
    method_local = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    for (val = (CONF_VALUE *)0x0; pCVar1 = (CONF_VALUE *)sk_CONF_VALUE_num(nval), val < pCVar1;
        val = (CONF_VALUE *)((long)&val->section + 1)) {
      pCVar1 = sk_CONF_VALUE_value(nval,(size_t)val);
      if ((pCVar1->value == (char *)0x0) || (pCVar1->name == (char *)0x0)) {
        ERR_put_error(0x14,0,0x81,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_pmaps.cc"
                      ,0x55);
        ERR_add_error_data(6,"section:",pCVar1->section,",name:",pCVar1->name,",value:",
                           pCVar1->value);
LAB_002e9f92:
        sk_POLICY_MAPPING_pop_free((stack_st_POLICY_MAPPING *)method_local,POLICY_MAPPING_free);
        return (void *)0x0;
      }
      a = POLICY_MAPPING_new();
      if ((a == (POLICY_MAPPING *)0x0) ||
         (sVar2 = sk_POLICY_MAPPING_push
                            ((stack_st_POLICY_MAPPING *)method_local,(POLICY_MAPPING *)a),
         sVar2 == 0)) {
        POLICY_MAPPING_free(a);
        goto LAB_002e9f92;
      }
      pAVar3 = OBJ_txt2obj(pCVar1->name,0);
      a->issuerDomainPolicy = pAVar3;
      pAVar3 = OBJ_txt2obj(pCVar1->value,0);
      a->subjectDomainPolicy = pAVar3;
      if ((a->issuerDomainPolicy == (ASN1_OBJECT *)0x0) ||
         (a->subjectDomainPolicy == (ASN1_OBJECT *)0x0)) {
        ERR_put_error(0x14,0,0x81,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_pmaps.cc"
                      ,99);
        ERR_add_error_data(6,"section:",pCVar1->section,",name:",pCVar1->name,",value:",
                           pCVar1->value);
        goto LAB_002e9f92;
      }
    }
  }
  return method_local;
}

Assistant:

static void *v2i_POLICY_MAPPINGS(const X509V3_EXT_METHOD *method,
                                 const X509V3_CTX *ctx,
                                 const STACK_OF(CONF_VALUE) *nval) {
  POLICY_MAPPINGS *pmaps = sk_POLICY_MAPPING_new_null();
  if (pmaps == NULL) {
    return NULL;
  }

  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *val = sk_CONF_VALUE_value(nval, i);
    if (!val->value || !val->name) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_OBJECT_IDENTIFIER);
      X509V3_conf_err(val);
      goto err;
    }

    POLICY_MAPPING *pmap = POLICY_MAPPING_new();
    if (pmap == NULL || !sk_POLICY_MAPPING_push(pmaps, pmap)) {
      POLICY_MAPPING_free(pmap);
      goto err;
    }

    pmap->issuerDomainPolicy = OBJ_txt2obj(val->name, 0);
    pmap->subjectDomainPolicy = OBJ_txt2obj(val->value, 0);
    if (!pmap->issuerDomainPolicy || !pmap->subjectDomainPolicy) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_OBJECT_IDENTIFIER);
      X509V3_conf_err(val);
      goto err;
    }
  }
  return pmaps;

err:
  sk_POLICY_MAPPING_pop_free(pmaps, POLICY_MAPPING_free);
  return NULL;
}